

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_mdtm(Curl_easy *data)

{
  CURLcode CVar1;
  
  if (((((data->set).field_0x8ca & 0x80) != 0) || ((data->set).timecondition != '\0')) &&
     ((data->conn->proto).ftpc.file != (char *)0x0)) {
    CVar1 = Curl_pp_sendf(data,&(data->conn->proto).ftpc.pp,"MDTM %s");
    if (CVar1 == CURLE_OK) {
      _ftp_state(data,'\x12');
      CVar1 = CURLE_OK;
    }
    return CVar1;
  }
  CVar1 = ftp_state_type(data);
  return CVar1;
}

Assistant:

static CURLcode ftp_state_mdtm(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  /* Requested time of file or time-depended transfer? */
  if((data->set.get_filetime || data->set.timecondition) && ftpc->file) {

    /* we have requested to get the modified-time of the file, this is a white
       spot as the MDTM is not mentioned in RFC959 */
    result = Curl_pp_sendf(data, &ftpc->pp, "MDTM %s", ftpc->file);

    if(!result)
      ftp_state(data, FTP_MDTM);
  }
  else
    result = ftp_state_type(data);

  return result;
}